

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

bool __thiscall QFileDevice::seek(QFileDevice *this,qint64 off)

{
  QIODevicePrivate *pQVar1;
  bool bVar2;
  char cVar3;
  FileError FVar4;
  FileError FVar5;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar2) {
    if ((char)pQVar1[1].transactionPos == '\x01') {
      *(undefined1 *)&pQVar1[1].transactionPos = 0;
      bVar2 = flush((QFileDevice *)pQVar1->q_ptr);
      if (!bVar2) goto LAB_0010db33;
    }
    cVar3 = (**(code **)(*pQVar1[1]._vptr_QIODevicePrivate + 0x40))
                      (pQVar1[1]._vptr_QIODevicePrivate,off);
    if (cVar3 != '\0') {
      bVar2 = QIODevice::seek(&this->super_QIODevice,off);
      if (bVar2) {
        QFileDevicePrivate::setError
                  ((QFileDevicePrivate *)
                   (this->super_QIODevice).d_ptr._M_t.
                   super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>
                   .super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl,NoError);
        bVar2 = true;
        goto LAB_0010db35;
      }
    }
    FVar4 = QAbstractFileEngine::error((QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    FVar5 = PositionError;
    if (FVar4 != UnspecifiedError) {
      FVar5 = FVar4;
    }
    QAbstractFileEngine::errorString
              (&local_40,(QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    *(FileError *)((long)&pQVar1[1].devicePos + 4) = FVar5;
    QString::operator=(&pQVar1->errorString,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_0010db33:
  bVar2 = false;
LAB_0010db35:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::seek(qint64 off)
{
    Q_D(QFileDevice);
    if (!isOpen()) {
        qWarning("QFileDevice::seek: IODevice is not open");
        return false;
    }

    if (!d->ensureFlushed())
        return false;

    if (!d->fileEngine->seek(off) || !QIODevice::seek(off)) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::PositionError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    unsetError();
    return true;
}